

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall
ImGuiTextFilter::TextRange::split
          (TextRange *this,char separator,ImVector<ImGuiTextFilter::TextRange> *out)

{
  int iVar1;
  TextRange *pTVar2;
  TextRange *pTVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  
  if (out->Capacity < 0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    pTVar3 = (TextRange *)0x0;
    pTVar2 = (TextRange *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    if (out->Data != (TextRange *)0x0) {
      memcpy(pTVar2,out->Data,(long)out->Size << 4);
      pTVar3 = out->Data;
      if (pTVar3 == (TextRange *)0x0) {
        pTVar3 = (TextRange *)0x0;
      }
      else {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
    }
    (*GImAllocatorFreeFunc)(pTVar3,GImAllocatorUserData);
    out->Data = pTVar2;
    out->Capacity = 0;
  }
  out->Size = 0;
  pcVar5 = this->b;
  pcVar4 = this->e;
  if (pcVar4 <= pcVar5) {
    return;
  }
  iVar8 = 0;
  pcVar6 = pcVar5;
  do {
    if (*pcVar5 == separator) {
      if (iVar8 == out->Capacity) {
        if (iVar8 == 0) {
          iVar1 = 8;
        }
        else {
          iVar1 = iVar8 / 2 + iVar8;
        }
        iVar7 = iVar8 + 1;
        if (iVar8 + 1 < iVar1) {
          iVar7 = iVar1;
        }
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
        pTVar3 = (TextRange *)(*GImAllocatorAllocFunc)((long)iVar7 << 4,GImAllocatorUserData);
        if (out->Data == (TextRange *)0x0) {
LAB_00147918:
          pTVar2 = (TextRange *)0x0;
        }
        else {
          memcpy(pTVar3,out->Data,(long)out->Size << 4);
          pTVar2 = out->Data;
          if (pTVar2 == (TextRange *)0x0) goto LAB_00147918;
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        }
        (*GImAllocatorFreeFunc)(pTVar2,GImAllocatorUserData);
        out->Data = pTVar3;
        out->Capacity = iVar7;
        iVar8 = out->Size;
      }
      else {
        pTVar3 = out->Data;
      }
      pTVar3[iVar8].b = pcVar6;
      pTVar3[iVar8].e = pcVar5;
      iVar8 = out->Size + 1;
      out->Size = iVar8;
      pcVar6 = pcVar5 + 1;
      pcVar4 = this->e;
    }
    pcVar5 = pcVar5 + 1;
  } while (pcVar5 < pcVar4);
  if (pcVar5 == pcVar6) {
    return;
  }
  if (iVar8 != out->Capacity) {
    pTVar3 = out->Data;
    goto LAB_001479fd;
  }
  if (iVar8 == 0) {
    iVar1 = 8;
  }
  else {
    iVar1 = iVar8 / 2 + iVar8;
  }
  iVar7 = iVar8 + 1;
  if (iVar8 + 1 < iVar1) {
    iVar7 = iVar1;
  }
  GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
  pTVar3 = (TextRange *)(*GImAllocatorAllocFunc)((long)iVar7 << 4,GImAllocatorUserData);
  if (out->Data == (TextRange *)0x0) {
LAB_001479e4:
    pTVar2 = (TextRange *)0x0;
  }
  else {
    memcpy(pTVar3,out->Data,(long)out->Size << 4);
    pTVar2 = out->Data;
    if (pTVar2 == (TextRange *)0x0) goto LAB_001479e4;
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
  }
  (*GImAllocatorFreeFunc)(pTVar2,GImAllocatorUserData);
  out->Data = pTVar3;
  out->Capacity = iVar7;
  iVar8 = out->Size;
LAB_001479fd:
  pTVar3[iVar8].b = pcVar6;
  pTVar3[iVar8].e = pcVar5;
  out->Size = out->Size + 1;
  return;
}

Assistant:

void ImGuiTextFilter::TextRange::split(char separator, ImVector<TextRange>& out)
{
    out.resize(0);
    const char* wb = b;
    const char* we = wb;
    while (we < e)
    {
        if (*we == separator)
        {
            out.push_back(TextRange(wb, we));
            wb = we + 1;
        }
        we++;
    }
    if (wb != we)
        out.push_back(TextRange(wb, we));
}